

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O3

byte * __thiscall
Js::ByteCodeBufferReader::ReadAsmJsModuleInfo
          (ByteCodeBufferReader *this,byte *current,FunctionBody *function)

{
  Type pBVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  PropertyIdArray PVar6;
  ModuleFunctionImport var;
  bool bVar7;
  Type TVar8;
  BOOL BVar9;
  uint uVar10;
  AsmJsModuleInfo *this_00;
  byte *pbVar11;
  undefined4 *puVar12;
  ModuleVar *buffer;
  PropertyIdArray *pPVar13;
  Recycler *pRVar14;
  char *pcVar15;
  PropertyIdArray *pPVar16;
  int iVar17;
  long lVar18;
  ModuleVar *modVar;
  ModuleVar *pMVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  Type TVar23;
  ModuleVarImport var_00;
  uint local_dc;
  undefined1 local_d8 [4];
  RegSlot regSlot;
  Type local_d0;
  long local_c8;
  Type local_c0;
  Type TStack_bc;
  ModuleFunctionImport funcImport;
  ModuleVarImport varImport;
  uint maxAccess;
  ModuleFunction local_80;
  Type local_7c;
  ModuleFunction modFunc;
  PropertyId key;
  int local_6c;
  uint local_68;
  int exportsCount;
  ModuleFunctionTable funcTable;
  Type local_44;
  PropertyIdArray *pPStack_40;
  int id;
  Type local_34 [2];
  int count;
  
  _modFunc = function;
  this_00 = FunctionBody::AllocateAsmJsModuleInfo(function);
  pbVar11 = ReadInt32(current,(size_t)(this->raw + ((long)this->totalSize - (long)current)),
                      (int *)local_34);
  this_00->mArgInCount = local_34[0];
  pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                      &local_6c);
  AsmJsModuleInfo::SetExportsCount(this_00,local_6c);
  pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                      (int *)local_34);
  AsmJsModuleInfo::InitializeSlotMap(this_00,local_34[0]);
  funcTable.moduleFunctionIndex.ptr = (uint *)this_00;
  if (0 < local_6c) {
    pPVar13 = (this_00->mExports).ptr;
    pbVar11 = ReadByte(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                       (byte *)&local_68);
    pPVar13->extraSlots = (Type)local_68;
    pbVar11 = ReadBool(this,pbVar11,(bool *)&funcImport);
    pPVar13->hadDuplicates = (Type)(undefined1)funcImport.location;
    pbVar11 = ReadBool(this,pbVar11,(bool *)&funcImport);
    pPVar13->has__proto__ = (Type)(undefined1)funcImport.location;
    pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                        (int *)local_34);
    pPVar13->count = local_34[0];
    pPStack_40 = pPVar13;
    if (local_34[0] != 0) {
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar21 = 0;
      do {
        pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                            (int *)&local_44);
        pBVar1 = _modFunc->byteCodeCache;
        iVar17 = local_44 - pBVar1->builtInPropertyCount;
        TVar8 = local_44;
        if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
          if (pBVar1->propertyCount <= iVar17) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                        ,0x99,"(realOffset<propertyCount)",
                                        "realOffset<propertyCount");
            if (!bVar7) goto LAB_00885150;
            *puVar12 = 0;
          }
          TVar8 = pBVar1->propertyIds[iVar17];
          if (TVar8 == 0xffffffff) {
            AssertCount = AssertCount + 1;
            local_c8 = (long)iVar17;
            Throw::LogAssert();
            *puVar12 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                        ,0x9a,"(propertyIds[realOffset]!=-1)",
                                        "propertyIds[realOffset]!=-1");
            if (!bVar7) goto LAB_00885150;
            *puVar12 = 0;
            TVar8 = pBVar1->propertyIds[local_c8];
          }
        }
        (&pPStack_40[1].count)[uVar21] = TVar8;
        uVar21 = uVar21 + 1;
      } while (uVar21 < pPStack_40->count);
    }
    if (0 < local_6c) {
      lVar18 = *(long *)(funcTable.moduleFunctionIndex.ptr + 0xc);
      lVar22 = 0;
      do {
        pbVar11 = ReadConstantSizedInt32
                            (pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                             &varImport.field);
        *(Type *)(lVar18 + lVar22 * 4) = varImport.field;
        lVar22 = lVar22 + 1;
      } while (lVar22 < local_6c);
    }
  }
  TVar23.ptr = funcTable.moduleFunctionIndex.ptr;
  pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                      (int *)&local_dc);
  TVar23.ptr[0xe] = local_dc;
  buffer = (ModuleVar *)
           ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                     (int *)local_34);
  AsmJsModuleInfo::SetVarCount((AsmJsModuleInfo *)TVar23.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    iVar17 = 0;
    pMVar19 = buffer;
    do {
      buffer = pMVar19 + 1;
      AsmJsModuleInfo::SetVar((AsmJsModuleInfo *)TVar23.ptr,iVar17,*pMVar19);
      iVar17 = iVar17 + 1;
      pMVar19 = buffer;
    } while (iVar17 < (int)local_34[0]);
  }
  pPVar13 = (PropertyIdArray *)
            ReadInt32((byte *)buffer,(size_t)(this->raw + ((long)this->totalSize - (long)buffer)),
                      (int *)local_34);
  AsmJsModuleInfo::SetVarImportCount((AsmJsModuleInfo *)TVar23.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    iVar17 = 0;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pbVar11 = ReadInt32((byte *)pPVar13,
                          (size_t)(this->raw + ((long)this->totalSize - (long)pPVar13)),
                          (int *)&funcImport);
      pbVar11 = ReadByte(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                         (byte *)&funcImport.field);
      pPVar13 = (PropertyIdArray *)
                ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                          (int *)&local_44);
      pBVar1 = _modFunc->byteCodeCache;
      iVar20 = local_44 - pBVar1->builtInPropertyCount;
      TVar8 = local_44;
      if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
        if (pBVar1->propertyCount <= iVar20) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar13;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar7) goto LAB_00885150;
          *puVar12 = 0;
          pPVar13 = pPStack_40;
        }
        TVar8 = pBVar1->propertyIds[iVar20];
        if (TVar8 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar13;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar7) goto LAB_00885150;
          *puVar12 = 0;
          TVar8 = pBVar1->propertyIds[iVar20];
          pPVar13 = pPStack_40;
        }
      }
      TVar23.ptr = funcTable.moduleFunctionIndex.ptr;
      var_00._1_7_ = funcImport._1_7_;
      var_00.location._0_1_ = (undefined1)funcImport.location;
      var_00.field = TVar8;
      varImport.location = TVar8;
      AsmJsModuleInfo::SetVarImport
                ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,iVar17,var_00);
      iVar17 = iVar17 + 1;
    } while (iVar17 < (int)local_34[0]);
  }
  pPVar13 = (PropertyIdArray *)
            ReadInt32((byte *)pPVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pPVar13)),
                      (int *)local_34);
  AsmJsModuleInfo::SetFunctionImportCount((AsmJsModuleInfo *)TVar23.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    iVar17 = 0;
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pbVar11 = ReadInt32((byte *)pPVar13,
                          (size_t)(this->raw + ((long)this->totalSize - (long)pPVar13)),
                          (int *)&local_c0);
      pPVar13 = (PropertyIdArray *)
                ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                          (int *)&local_44);
      pBVar1 = _modFunc->byteCodeCache;
      iVar20 = local_44 - pBVar1->builtInPropertyCount;
      TVar8 = local_44;
      if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
        if (pBVar1->propertyCount <= iVar20) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar13;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar7) goto LAB_00885150;
          *puVar12 = 0;
          pPVar13 = pPStack_40;
        }
        TVar8 = pBVar1->propertyIds[iVar20];
        if (TVar8 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar13;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar7) goto LAB_00885150;
          *puVar12 = 0;
          TVar8 = pBVar1->propertyIds[iVar20];
          pPVar13 = pPStack_40;
        }
      }
      TVar23.ptr = funcTable.moduleFunctionIndex.ptr;
      var.field = TVar8;
      var.location = local_c0;
      TStack_bc = TVar8;
      AsmJsModuleInfo::SetFunctionImport
                ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,iVar17,var);
      iVar17 = iVar17 + 1;
    } while (iVar17 < (int)local_34[0]);
  }
  pbVar11 = ReadInt32((byte *)pPVar13,(size_t)(this->raw + ((long)this->totalSize - (long)pPVar13)),
                      (int *)local_34);
  AsmJsModuleInfo::SetFunctionCount((AsmJsModuleInfo *)TVar23.ptr,local_34[0]);
  if (0 < (int)local_34[0]) {
    iVar17 = 0;
    do {
      pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                          (int *)&local_80);
      AsmJsModuleInfo::SetFunction((AsmJsModuleInfo *)TVar23.ptr,iVar17,local_80);
      iVar17 = iVar17 + 1;
    } while (iVar17 < (int)local_34[0]);
  }
  pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                      (int *)local_34);
  AsmJsModuleInfo::SetFunctionTableCount((AsmJsModuleInfo *)TVar23.ptr,local_34[0]);
  funcTable.size = 0;
  funcTable._4_4_ = 0;
  if (0 < (int)local_34[0]) {
    pPStack_40 = (PropertyIdArray *)__tls_get_addr(&PTR_01548f08);
    iVar17 = 0;
    do {
      pbVar11 = ReadInt32(pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11)),
                          (int *)&local_68);
      if (local_68 == 0) {
        funcTable.size = 0;
        funcTable._4_4_ = 0;
LAB_00884e9b:
        uVar10 = 0;
      }
      else {
        stack0xffffffffffffff58 = &unsigned_int::typeinfo;
        pRVar14 = Memory::Recycler::TrackAllocInfo
                            (this->scriptContext->recycler,(TrackAllocData *)&varImport.field);
        uVar21 = (ulong)local_68;
        if (uVar21 == 0) {
          Memory::Recycler::ClearTrackAllocInfo(pRVar14,(TrackAllocData *)0x0);
          pcVar15 = &DAT_00000008;
        }
        else {
          BVar9 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar9 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar13 = pPStack_40;
            pPStack_40->count = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                        "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar7) goto LAB_00885150;
            pPVar13->count = 0;
          }
          pcVar15 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                              (pRVar14,uVar21 << 2);
          if (pcVar15 == (char *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            pPVar13 = pPStack_40;
            pPStack_40->count = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                        ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar7) goto LAB_00885150;
            pPVar13->count = 0;
            pcVar15 = (char *)0x0;
          }
        }
        Memory::Recycler::WBSetBit((char *)&funcTable);
        funcTable._0_8_ = pcVar15;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&funcTable);
        if (local_68 == 0) goto LAB_00884e9b;
        lVar18 = 0;
        uVar21 = 0;
        do {
          pbVar11 = ReadConstantSizedInt32
                              (pbVar11,(size_t)(this->raw + ((long)this->totalSize - (long)pbVar11))
                               ,(int *)(funcTable._0_8_ + lVar18));
          uVar21 = uVar21 + 1;
          lVar18 = lVar18 + 4;
          uVar10 = local_68;
        } while (uVar21 < local_68);
      }
      uVar3 = funcTable._0_8_;
      local_d8 = (undefined1  [4])uVar10;
      Memory::Recycler::WBSetBit((char *)&local_d0);
      local_d0.ptr = (uint *)uVar3;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_d0);
      AsmJsModuleInfo::SetFunctionTable
                ((AsmJsModuleInfo *)funcTable.moduleFunctionIndex.ptr,iVar17,
                 (ModuleFunctionTable *)local_d8);
      iVar17 = iVar17 + 1;
    } while (iVar17 < (int)local_34[0]);
  }
  TVar23.ptr = funcTable.moduleFunctionIndex.ptr;
  funcTable.moduleFunctionIndex.ptr[0x22] = *(uint *)(pbVar11 + 0x20);
  uVar3 = *(undefined8 *)pbVar11;
  uVar4 = *(undefined8 *)(pbVar11 + 8);
  uVar5 = *(undefined8 *)(pbVar11 + 0x18);
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x1e) = *(undefined8 *)(pbVar11 + 0x10);
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x20) = uVar5;
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x1a) = uVar3;
  *(undefined8 *)(funcTable.moduleFunctionIndex.ptr + 0x1c) = uVar4;
  pPVar13 = (PropertyIdArray *)
            ReadInt32(pbVar11 + 0x24,
                      (size_t)(this->raw + ((long)this->totalSize - (long)(pbVar11 + 0x24))),
                      (int *)local_34);
  if (0 < (int)local_34[0]) {
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    iVar17 = 0;
    do {
      pPVar16 = (PropertyIdArray *)
                ReadInt32((byte *)pPVar13,
                          (size_t)(this->raw + ((long)this->totalSize - (long)pPVar13)),
                          (int *)&local_44);
      pBVar1 = _modFunc->byteCodeCache;
      iVar20 = local_44 - pBVar1->builtInPropertyCount;
      TVar8 = local_44;
      if (local_44 != 0xffffffff && pBVar1->builtInPropertyCount <= (int)local_44) {
        if (pBVar1->propertyCount <= iVar20) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar16;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x99,"(realOffset<propertyCount)","realOffset<propertyCount")
          ;
          if (!bVar7) {
LAB_00885150:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar12 = 0;
          pPVar16 = pPStack_40;
        }
        TVar8 = pBVar1->propertyIds[iVar20];
        if (TVar8 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          pPStack_40 = pPVar16;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeSerializer.h"
                                      ,0x9a,"(propertyIds[realOffset]!=-1)",
                                      "propertyIds[realOffset]!=-1");
          if (!bVar7) goto LAB_00885150;
          *puVar12 = 0;
          TVar8 = pBVar1->propertyIds[iVar20];
          pPVar16 = pPStack_40;
        }
      }
      pPVar13 = pPVar16 + 3;
      stack0xffffffffffffff58 = &AsmJsSlot::typeinfo;
      local_7c = TVar8;
      pRVar14 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)&varImport.field);
      register0x00000000 = (undefined **)new<Memory::Recycler>(0x18,pRVar14,0x387914);
      TVar23 = funcTable.moduleFunctionIndex;
      ((PropertyIdArray *)register0x00000000)->count = 0;
      ((PropertyIdArray *)register0x00000000)->extraSlots = '\0';
      ((PropertyIdArray *)register0x00000000)->hadDuplicates = false;
      ((PropertyIdArray *)register0x00000000)->has__proto__ = false;
      ((PropertyIdArray *)register0x00000000)->hasNonSimpleParams = false;
      ((PropertyIdArray *)register0x00000000)[1].count = 0;
      ((PropertyIdArray *)register0x00000000)[1].extraSlots = '\0';
      ((PropertyIdArray *)register0x00000000)[1].hadDuplicates = false;
      ((PropertyIdArray *)register0x00000000)[1].has__proto__ = false;
      ((PropertyIdArray *)register0x00000000)[1].hasNonSimpleParams = false;
      ((PropertyIdArray *)register0x00000000)[2].count = 0;
      ((PropertyIdArray *)register0x00000000)[2].extraSlots = '\0';
      ((PropertyIdArray *)register0x00000000)[2].hadDuplicates = false;
      ((PropertyIdArray *)register0x00000000)[2].has__proto__ = false;
      ((PropertyIdArray *)register0x00000000)[2].hasNonSimpleParams = false;
      *(char *)&((PropertyIdArray *)register0x00000000)[2].count = (char)pPVar16[2].count;
      PVar6 = pPVar16[1];
      *register0x00000000 = (undefined *)*pPVar16;
      ((PropertyIdArray *)register0x00000000)[1] = PVar6;
      JsUtil::
      BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                (*(BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                   **)(funcTable.moduleFunctionIndex.ptr + 0x24),(int *)&local_7c,
                 (AsmJsSlot **)&varImport.field);
      iVar17 = iVar17 + 1;
    } while (iVar17 < (int)local_34[0]);
  }
  *(PropertyIdArray *)(TVar23.ptr + 0x26) = *pPVar13;
  *(PropertyIdArray *)(TVar23.ptr + 0x28) = pPVar13[1];
  pbVar11 = ReadInt32((byte *)(pPVar13 + 2),
                      (size_t)(this->raw + ((long)this->totalSize - (long)(pPVar13 + 2))),
                      &varImport.field);
  TVar23.ptr[0x2a] = varImport.field;
  return pbVar11;
}

Assistant:

const byte * ReadAsmJsModuleInfo(const byte * current, FunctionBody * function)
    {
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int constant;
        current = ReadInt32(current, &constant);
        Assert(constant == magicStartOfAsmJsModuleInfo);
#endif
        AsmJsModuleInfo* moduleInfo = function->AllocateAsmJsModuleInfo();

        int count;
        current = ReadInt32(current, &count);
        moduleInfo->SetArgInCount(count);

        int exportsCount;
        current = ReadInt32(current, &exportsCount);
        moduleInfo->SetExportsCount(exportsCount);

        current = ReadInt32(current, &count);
        moduleInfo->InitializeSlotMap(count);

        int id;
        if (exportsCount > 0)
        {
            PropertyIdArray * propArray = moduleInfo->GetExportsIdArray();

            byte extraSlots;
            current = ReadByte(current, &extraSlots);
            propArray->extraSlots = extraSlots;

            bool boolVal;
            current = ReadBool(current, &boolVal);
            propArray->hadDuplicates = boolVal;

            current = ReadBool(current, &boolVal);
            propArray->has__proto__ = boolVal;

            current = ReadInt32(current, &count);
            propArray->count = count;

            for (uint i = 0; i < propArray->count; i++)
            {
                current = ReadInt32(current, &id);
                PropertyId propertyId = function->GetByteCodeCache()->LookupPropertyId(id);
                propArray->elements[i] = propertyId;
            }

            RegSlot* exportLocations = moduleInfo->GetExportsFunctionLocation();
            for (int i = 0; i < exportsCount; i++)
            {
                int32 loc;
                current = ReadConstantSizedInt32(current, &loc);
                exportLocations[i] = (uint32)loc;
            }
        }
        RegSlot regSlot;
        current = ReadUInt32(current, &regSlot);
        moduleInfo->SetExportFunctionIndex(regSlot);

        current = ReadInt32(current, &count);
        moduleInfo->SetVarCount(count);

        for (int i = 0; i < count; i++)
        {
            serialization_alignment AsmJsModuleInfo::ModuleVar * modVar;
            current = ReadStruct<AsmJsModuleInfo::ModuleVar>(current, &modVar);
            moduleInfo->SetVar(i, *modVar);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetVarImportCount(count);
        AsmJsModuleInfo::ModuleVarImport varImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &varImport.location);
            current = ReadByte(current, (byte*)&varImport.type);
            current = ReadInt32(current, &id);
            varImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetVarImport(i, varImport);
        }


        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionImportCount(count);
        AsmJsModuleInfo::ModuleFunctionImport funcImport;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcImport.location);
            current = ReadInt32(current, &id);
            funcImport.field = function->GetByteCodeCache()->LookupPropertyId(id);
            moduleInfo->SetFunctionImport(i, funcImport);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionCount(count);

        AsmJsModuleInfo::ModuleFunction modFunc;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &modFunc.location);
            moduleInfo->SetFunction(i, modFunc);
        }

        current = ReadInt32(current, &count);
        moduleInfo->SetFunctionTableCount(count);

        AsmJsModuleInfo::ModuleFunctionTable funcTable;
        for (int i = 0; i < count; i++)
        {
            current = ReadUInt32(current, &funcTable.size);
            if (funcTable.size > 0)
            {
                funcTable.moduleFunctionIndex = RecyclerNewArray(this->scriptContext->GetRecycler(), RegSlot, funcTable.size);
            }
            else
            {
                funcTable.moduleFunctionIndex = nullptr;
            }
            for (uint j = 0; j < funcTable.size; j++)
            {
                current = ReadConstantSizedInt32(current, (int32*)&funcTable.moduleFunctionIndex[j]);
            }
            moduleInfo->SetFunctionTable(i, funcTable);
        }

        serialization_alignment AsmJsModuleMemory * modMem = (serialization_alignment AsmJsModuleMemory*)current;
        moduleInfo->SetModuleMemory(*modMem);
        current = current + sizeof(serialization_alignment AsmJsModuleMemory);

        current = ReadInt32(current, &count);
        for (int i = 0; i < count; i++)
        {

            current = ReadInt32(current, &id);
            PropertyId key = function->GetByteCodeCache()->LookupPropertyId(id);

            serialization_alignment AsmJsSlot * slot = (serialization_alignment AsmJsSlot*)current;
            current = current + sizeof(serialization_alignment AsmJsSlot);

            // copy the slot to recycler memory
            AsmJsSlot * recyclerSlot = RecyclerNew(scriptContext->GetRecycler(), AsmJsSlot);
            *recyclerSlot = *slot;
            moduleInfo->GetAsmJsSlotMap()->Add(key, recyclerSlot);
        }

        serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE> * mathBV = (serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMMATH_BUILTIN_SIZE>);
        moduleInfo->SetAsmMathBuiltinUsed(*mathBV);

        serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE> * arrayBV = (serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>*)current;
        current = current + sizeof(serialization_alignment BVStatic<ASMARRAY_BUILTIN_SIZE>);
        moduleInfo->SetAsmArrayBuiltinUsed(*arrayBV);

        uint maxAccess;
        current = ReadUInt32(current, &maxAccess);
        moduleInfo->SetMaxHeapAccess(maxAccess);

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        current = ReadInt32(current, &constant);
        Assert(constant == magicEndOfAsmJsModuleInfo);
#endif

        return current;
    }